

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::ArrayReverseMethod::ArrayReverseMethod(ArrayReverseMethod *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"reverse",&local_31);
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,&local_30,Function);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_004752e0;
  return;
}

Assistant:

ArrayReverseMethod() : SystemSubroutine("reverse", SubroutineKind::Function) {}